

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsscene.cpp
# Opt level: O3

void __thiscall
QGraphicsScenePrivate::drawItemHelper
          (QGraphicsScenePrivate *this,QGraphicsItem *item,QPainter *painter,
          QStyleOptionGraphicsItem *option,QWidget *widget,bool painterStateProtection)

{
  QPoint QVar1;
  QGraphicsItemPrivate *this_00;
  QWidgetData *pQVar2;
  QPoint QVar3;
  qreal qVar4;
  qreal qVar5;
  undefined1 auVar6 [16];
  QRect QVar7;
  QRect QVar8;
  QRect QVar9;
  QRect QVar10;
  Key KVar11;
  bool bVar12;
  char cVar13;
  byte bVar15;
  int iVar16;
  undefined4 uVar18;
  undefined4 extraout_EAX;
  QGraphicsProxyWidget *this_01;
  QWidget *pQVar19;
  QGraphicsItemCache *pQVar20;
  char cVar14;
  RenderHints RVar17;
  undefined8 uVar21;
  DeviceData *pDVar22;
  QTransform *pQVar23;
  qreal *pqVar24;
  QSize QVar25;
  long lVar26;
  qreal *pqVar27;
  Representation RVar28;
  Representation RVar29;
  int iVar30;
  long lVar31;
  int iVar32;
  QRectF *rect_2;
  int iVar33;
  QSize QVar34;
  QVariant *pQVar35;
  undefined8 *puVar36;
  Representation RVar37;
  code **ppcVar38;
  DeviceData *pDVar39;
  bool *pbVar40;
  undefined8 *puVar41;
  int iVar42;
  int iVar43;
  int iVar44;
  QRectF *rect;
  uint uVar45;
  QRectF *rect_1;
  long in_FS_OFFSET;
  bool bVar46;
  byte bVar47;
  ulong uVar48;
  Representation RVar49;
  double c;
  double dVar50;
  qreal qVar51;
  double dVar52;
  double dVar53;
  undefined1 auVar54 [16];
  Representation RVar56;
  undefined1 auVar55 [16];
  double dVar57;
  double dVar58;
  double dVar59;
  uint uVar61;
  undefined1 auVar60 [16];
  Representation RVar62;
  double dVar63;
  Representation RVar64;
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  QRegion pixmapExposed_1;
  bool invertable;
  QRegion pixmapExposed;
  Key pixmapKey;
  QRegion exposed;
  QTransform pixmapToItem;
  QTransform itemToPixmap;
  Representation local_298;
  Representation RStack_294;
  QSize local_238;
  double local_230;
  double local_228;
  double local_220;
  undefined1 local_218 [24];
  qreal qStack_200;
  QRegion local_1f0;
  QRegion local_1e8;
  char local_1d9;
  QRect local_1d8;
  QRect local_1c8;
  QRectF local_1b8;
  undefined1 *local_198;
  undefined1 *puStack_190;
  undefined1 *local_188;
  Key local_180;
  Representation local_178;
  Representation RStack_174;
  undefined4 uStack_170;
  undefined4 uStack_16c;
  undefined4 local_168;
  undefined4 uStack_164;
  undefined4 uStack_160;
  undefined4 uStack_15c;
  QRectF local_158;
  undefined1 local_138 [8];
  undefined8 uStack_130;
  undefined1 *local_128;
  qreal qStack_120;
  undefined2 local_f0;
  QTransform local_e8;
  code *local_98 [3];
  undefined8 local_80;
  undefined2 local_50;
  Key local_40;
  long local_38;
  
  QVar8._8_8_ = local_1c8._8_8_;
  QVar8._0_8_ = local_1c8._0_8_;
  bVar47 = 0;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (item->d_ptr).d;
  uVar45 = *(uint *)&this_00->field_0x160 >> 0x15 & 3;
  if (uVar45 == 0) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      _q_paintItem(item,painter,option,widget,true,painterStateProtection);
      return;
    }
    goto LAB_0060b7e5;
  }
  QPainter::device();
  c = (double)QPaintDevice::devicePixelRatio();
  dVar50 = (double)QPainter::opacity();
  bVar12 = QGraphicsItem::isWidget(item);
  dVar52 = dVar50;
  if (((bVar12) &&
      (this_01 = (QGraphicsProxyWidget *)
                 QMetaObject::cast((QObject *)&QGraphicsProxyWidget::staticMetaObject),
      this_01 != (QGraphicsProxyWidget *)0x0)) &&
     (pQVar19 = QGraphicsProxyWidget::widget(this_01), pQVar19 != (QWidget *)0x0)) {
    pQVar19 = QGraphicsProxyWidget::widget(this_01);
    qVar51 = QWidget::windowOpacity(pQVar19);
    dVar52 = (double)(~-(ulong)(qVar51 < 1.0) & (ulong)dVar50 |
                     (ulong)(dVar50 * qVar51) & -(ulong)(qVar51 < 1.0));
  }
  local_168 = 0xffffffff;
  uStack_164 = 0xffffffff;
  uStack_160 = 0xffffffff;
  uStack_15c = 0xffffffff;
  local_178.m_i = -1;
  RStack_174.m_i = -1;
  uStack_170 = 0xffffffff;
  uStack_16c = 0xffffffff;
  (*item->_vptr_QGraphicsItem[3])(&local_178,item);
  auVar66._8_8_ = local_158.yp;
  auVar66._0_8_ = local_158.xp;
  QVar10.x2.m_i = local_1c8.x2.m_i;
  QVar10.y2.m_i = local_1c8.y2.m_i;
  QVar10.x1.m_i = local_1c8.x1.m_i;
  QVar10.y1.m_i = local_1c8.y1.m_i;
  QVar8.x2.m_i = local_1c8.x2.m_i;
  QVar8.y2.m_i = local_1c8.y2.m_i;
  QVar8.x1.m_i = local_1c8.x1.m_i;
  QVar8.y1.m_i = local_1c8.y1.m_i;
  if ((0.0 <= (double)CONCAT44(uStack_164,local_168)) &&
     (uVar48 = -(ulong)((double)CONCAT44(uStack_164,local_168) != 0.0), QVar8 = QVar10,
     local_158._0_16_ = auVar66,
     0.0 <= (double)(uVar48 & CONCAT44(uStack_15c,uStack_160) |
                    ~uVar48 & (ulong)((double)CONCAT44(uStack_15c,uStack_160) + 0.0)))) {
    local_180.d = (KeyData *)&DAT_aaaaaaaaaaaaaaaa;
    QPixmapCache::Key::Key(&local_180);
    local_188 = &DAT_aaaaaaaaaaaaaaaa;
    local_198 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_190 = &DAT_aaaaaaaaaaaaaaaa;
    QPixmap::QPixmap((QPixmap *)&local_198);
    pQVar20 = QGraphicsItemPrivate::extraItemCache(this_00);
    if (uVar45 == 1) {
      QPixmapCache::Key::operator=(&local_180,&pQVar20->key);
      cVar13 = QPixmapCache::find(&local_180,(QPixmap *)&local_198);
      uVar45 = (pQVar20->fixedSize).ht.m_i;
      uVar61 = (pQVar20->fixedSize).wd.m_i;
      auVar66 = QRectF::toAlignedRect();
      bVar46 = (int)(uVar61 | uVar45) < 0;
      bVar12 = !bVar46;
      if (bVar46) {
        QVar34.wd.m_i = (auVar66._8_4_ - auVar66._0_4_) + 1;
        QVar34.ht.m_i = 0;
        RVar29.m_i = (auVar66._12_4_ - auVar66._4_4_) + 1;
        RVar37.m_i = (pQVar20->fixedSize).wd.m_i;
        RVar28.m_i = (pQVar20->fixedSize).ht.m_i;
      }
      else {
        QVar34 = pQVar20->fixedSize;
        RVar28 = QVar34.ht.m_i;
        RVar37 = QVar34.wd.m_i;
        RVar29.m_i = RVar28.m_i;
      }
      dVar53 = (double)QVar34.wd.m_i.m_i * c;
      dVar53 = (double)((ulong)dVar53 & 0x8000000000000000 | 0x3fe0000000000000) + dVar53;
      dVar63 = dVar53;
      if (dVar53 <= -2147483648.0) {
        dVar63 = -2147483648.0;
      }
      dVar57 = (double)((ulong)((double)RVar29.m_i * c) & 0x8000000000000000 | 0x3fe0000000000000) +
               (double)RVar29.m_i * c;
      dVar58 = dVar57;
      if (dVar57 <= -2147483648.0) {
        dVar58 = -2147483648.0;
      }
      iVar16 = (RVar28.m_i | RVar37.m_i) >> 0x1f;
      dVar59 = 0.0;
      if ((RVar28.m_i | RVar37.m_i) < 0) {
        dVar59 = -2.0;
      }
      iVar43 = (int)(double)(-(ulong)(2147483647.0 < dVar53) & 0x41dfffffffc00000 |
                            ~-(ulong)(2147483647.0 < dVar53) & (ulong)dVar63);
      iVar44 = (int)(double)(-(ulong)(2147483647.0 < dVar57) & 0x41dfffffffc00000 |
                            ~-(ulong)(2147483647.0 < dVar57) & (ulong)dVar58);
      iVar32 = iVar16 * -4;
      iVar30 = (int)((double)(iVar16 * -2) / c);
      iVar16 = auVar66._0_4_ + (int)(dVar59 / c);
      iVar42 = auVar66._4_4_ + (int)(dVar59 / c);
      iVar33 = auVar66._8_4_ + iVar30;
      iVar30 = auVar66._12_4_ + iVar30;
      cVar14 = QPixmap::isNull();
      if (cVar14 == '\0') {
        if (!bVar12) {
          uVar48 = (ulong)(uint)(iVar32 + iVar44);
          uVar21 = QPixmap::size();
          if ((iVar32 + iVar43 != (int)uVar21) || (iVar32 + iVar44 != (uint)((ulong)uVar21 >> 0x20))
             ) goto LAB_0060a518;
        }
        if (((pQVar20->boundingRect).x1.m_i != iVar16) ||
           ((((pQVar20->boundingRect).x2.m_i != iVar33 || ((pQVar20->boundingRect).y1.m_i != iVar42)
             ) || ((pQVar20->boundingRect).y2.m_i != iVar30)))) goto LAB_0060a61c;
        if (((pQVar20->allExposed & 1U) != 0) || ((pQVar20->exposed).d.size != 0))
        goto LAB_0060a648;
      }
      else {
        uVar48 = (ulong)(uint)(iVar32 + iVar44);
LAB_0060a518:
        local_138 = (undefined1  [8])((ulong)(uint)(iVar32 + iVar43) | uVar48 << 0x20);
        QPixmap::QPixmap((QPixmap *)&local_e8,(QSize *)local_138);
        local_98[2] = (code *)&DAT_aaaaaaaaaaaaaaaa;
        local_98[0] = (code *)&DAT_aaaaaaaaaaaaaaaa;
        local_98[1] = (code *)&DAT_aaaaaaaaaaaaaaaa;
        QPaintDevice::QPaintDevice((QPaintDevice *)local_98);
        qVar51 = local_e8.m_matrix[0][2];
        local_98[2] = (code *)local_188;
        local_98[0] = QDataStream::operator<<;
        local_e8.m_matrix[0][2] = 0.0;
        local_188 = (undefined1 *)qVar51;
        QPixmap::~QPixmap((QPixmap *)local_98);
        QPixmap::~QPixmap((QPixmap *)&local_e8);
LAB_0060a61c:
        (pQVar20->boundingRect).x1 = (Representation)iVar16;
        (pQVar20->boundingRect).y1 = (Representation)iVar42;
        (pQVar20->boundingRect).x2 = (Representation)iVar33;
        (pQVar20->boundingRect).y2 = (Representation)iVar30;
        QList<QRectF>::clear(&pQVar20->exposed);
        pQVar20->allExposed = true;
LAB_0060a648:
        if (cVar13 != '\0') {
          QPixmapCache::remove(&local_180);
        }
        puVar36 = &DAT_006f3c60;
        ppcVar38 = local_98;
        for (lVar31 = 10; lVar31 != 0; lVar31 = lVar31 + -1) {
          *ppcVar38 = (code *)*puVar36;
          puVar36 = puVar36 + (ulong)bVar47 * -2 + 1;
          ppcVar38 = ppcVar38 + (ulong)bVar47 * -2 + 1;
        }
        puVar36 = &DAT_006f3c18;
        ppcVar38 = local_98;
        for (lVar31 = 9; lVar31 != 0; lVar31 = lVar31 + -1) {
          *ppcVar38 = (code *)*puVar36;
          puVar36 = puVar36 + (ulong)bVar47 * -2 + 1;
          ppcVar38 = ppcVar38 + (ulong)bVar47 * -2 + 1;
        }
        local_50 = 0xa800;
        if (bVar12) {
          QTransform::scale(((double)iVar43 / c) / (double)CONCAT44(uStack_164,local_168),
                            ((double)iVar44 / c) / (double)CONCAT44(uStack_15c,uStack_160));
        }
        QTransform::translate((double)-iVar16,(double)-iVar42);
        QStyleOption::operator=
                  (&(this->styleOptionTmp).super_QStyleOption,&option->super_QStyleOption);
        qVar51 = (option->exposedRect).yp;
        qVar4 = (option->exposedRect).w;
        qVar5 = (option->exposedRect).h;
        (this->styleOptionTmp).exposedRect.xp = (option->exposedRect).xp;
        (this->styleOptionTmp).exposedRect.yp = qVar51;
        (this->styleOptionTmp).exposedRect.w = qVar4;
        (this->styleOptionTmp).exposedRect.h = qVar5;
        local_1b8.xp = (qreal)&DAT_aaaaaaaaaaaaaaaa;
        QRegion::QRegion((QRegion *)&local_1b8);
        auVar6._8_8_ = local_158.yp;
        auVar6._0_8_ = local_158.xp;
        local_128 = (undefined1 *)0x0;
        qStack_120 = 0.0;
        local_138._0_4_ = 0;
        local_138._4_4_ = 0;
        uStack_130 = (undefined1 *)0x0;
        if (pQVar20->allExposed == false) {
          lVar31 = (pQVar20->exposed).d.size;
          if (lVar31 != 0) {
            lVar31 = lVar31 << 5;
            do {
              QRectF::operator|((QRectF *)&local_e8,(QRectF *)local_138);
              local_128 = (undefined1 *)local_e8.m_matrix[0][2];
              qStack_120 = local_e8.m_matrix[1][0];
              local_138 = (undefined1  [8])local_e8.m_matrix[0][0];
              uStack_130 = (undefined1 *)local_e8.m_matrix[0][1];
              QTransform::mapRect((QRectF *)&local_e8);
              auVar66 = QRectF::toAlignedRect();
              local_158._0_16_ = auVar66;
              QRegion::operator+=((QRegion *)&local_1b8,(QRect *)&local_158);
              lVar31 = lVar31 + -0x20;
            } while (lVar31 != 0);
          }
        }
        else {
          local_138._4_4_ = RStack_174.m_i;
          local_138._0_4_ = local_178.m_i;
          uStack_130 = (undefined1 *)CONCAT44(uStack_16c,uStack_170);
          local_128 = (undefined1 *)CONCAT44(uStack_164,local_168);
          qStack_120 = (qreal)CONCAT44(uStack_15c,uStack_160);
          local_158._0_16_ = auVar6;
        }
        (this->styleOptionTmp).exposedRect.w = (qreal)local_128;
        (this->styleOptionTmp).exposedRect.h = qStack_120;
        (this->styleOptionTmp).exposedRect.xp = (qreal)local_138;
        (this->styleOptionTmp).exposedRect.yp = (qreal)uStack_130;
        QPixmap::setDevicePixelRatio(c);
        RVar17.super_QFlagsStorageHelper<QPainter::RenderHint,_4>.
        super_QFlagsStorage<QPainter::RenderHint>.i =
             (QFlagsStorageHelper<QPainter::RenderHint,_4>)QPainter::renderHints();
        _q_paintIntoCache((QPixmap *)&local_198,item,(QRegion *)&local_1b8,(QTransform *)local_98,
                          RVar17,&this->styleOptionTmp,painterStateProtection);
        QPixmapCache::insert((QPixmap *)&local_e8);
        QVar25 = (QSize)(pQVar20->key).d;
        (pQVar20->key).d = (KeyData *)local_e8.m_matrix[0][0];
        local_e8.m_matrix[0][0] = (qreal)QVar25;
        QPixmapCache::Key::~Key((Key *)&local_e8);
        pQVar20->allExposed = false;
        QList<QRectF>::clear(&pQVar20->exposed);
        QRegion::~QRegion((QRegion *)&local_1b8);
      }
      if ((dVar52 != dVar50) || (NAN(dVar52) || NAN(dVar50))) {
        QPainter::setOpacity(dVar52);
        local_98[0] = (code *)(double)iVar16;
        local_98[1] = (code *)(double)iVar42;
        QPainter::drawPixmap((QPointF *)painter,(QPixmap *)local_98);
        QPainter::setOpacity(dVar50);
        QVar9.x2.m_i = local_1c8.x2.m_i;
        QVar9.y2.m_i = local_1c8.y2.m_i;
        QVar9.x1.m_i = local_1c8.x1.m_i;
        QVar9.y1.m_i = local_1c8.y1.m_i;
      }
      else {
        local_98[0] = (code *)(double)iVar16;
        local_98[1] = (code *)(double)iVar42;
        QPainter::drawPixmap((QPointF *)painter,(QPixmap *)local_98);
        QVar9.x2.m_i = local_1c8.x2.m_i;
        QVar9.y2.m_i = local_1c8.y2.m_i;
        QVar9.x1.m_i = local_1c8.x1.m_i;
        QVar9.y1.m_i = local_1c8.y1.m_i;
      }
    }
    else {
      QVar25 = (QSize)&widget->super_QPaintDevice;
      if (widget == (QWidget *)0x0) {
        QVar25.wd.m_i = 0;
        QVar25.ht.m_i = 0;
      }
      local_e8.m_matrix[0][0] = (qreal)QVar25;
      QHash<QPaintDevice_*,_QGraphicsItemCache::DeviceData>::value
                ((DeviceData *)local_98,&pQVar20->deviceData,(QPaintDevice **)&local_e8);
      KVar11.d = local_180.d;
      local_180.d = local_40.d;
      local_40.d = KVar11.d;
      QPixmapCache::Key::~Key(&local_40);
      cVar13 = QPixmapCache::find(&local_180,(QPixmap *)&local_198);
      QVar9.x2.m_i = local_1c8.x2.m_i;
      QVar9.y2.m_i = local_1c8.y2.m_i;
      QVar9.x1.m_i = local_1c8.x1.m_i;
      QVar9.y1.m_i = local_1c8.y1.m_i;
      if (uVar45 == 2) {
        local_1b8.w._0_4_ = 0xffffffff;
        local_1b8.w._4_4_ = 0xffffffff;
        local_1b8.h._0_4_ = 0xffffffff;
        local_1b8.h._4_4_ = 0xffffffff;
        local_1b8.xp = -NAN;
        local_1b8.yp._0_4_ = 0xffffffff;
        local_1b8.yp._4_4_ = 0xffffffff;
        QPainter::worldTransform();
        QTransform::mapRect(&local_1b8);
        auVar65._0_8_ =
             (double)((ulong)local_1b8.xp & 0x8000000000000000 | 0x3fe0000000000000) + local_1b8.xp;
        auVar65._8_8_ =
             (double)(((ulong)local_1b8.yp._4_4_ & 0x80000000) << 0x20 | 0x3fe0000000000000) +
             (double)CONCAT44(local_1b8.yp._4_4_,local_1b8.yp._0_4_);
        auVar66 = maxpd(auVar65,_DAT_006605e0);
        iVar16 = (int)(double)(~-(ulong)(2147483647.0 < auVar65._0_8_) & auVar66._0_8_ |
                              -(ulong)(2147483647.0 < auVar65._0_8_) & 0x41dfffffffc00000);
        iVar30 = (int)(double)(~-(ulong)(2147483647.0 < auVar65._8_8_) & auVar66._8_8_ |
                              -(ulong)(2147483647.0 < auVar65._8_8_) & 0x41dfffffffc00000);
        dVar63 = (local_1b8.xp - (double)iVar16) * 0.5 +
                 (double)CONCAT44(local_1b8.w._4_4_,local_1b8.w._0_4_);
        dVar53 = ((double)CONCAT44(local_1b8.yp._4_4_,local_1b8.yp._0_4_) - (double)iVar30) * 0.5 +
                 (double)CONCAT44(local_1b8.h._4_4_,local_1b8.h._0_4_);
        auVar54._0_8_ = (double)((ulong)dVar63 & 0x8000000000000000 | 0x3fe0000000000000) + dVar63;
        auVar54._8_8_ = (double)((ulong)dVar53 & 0x8000000000000000 | 0x3fe0000000000000) + dVar53;
        auVar66 = maxpd(auVar54,_DAT_006605e0);
        RVar62.m_i = iVar16 + -1;
        RVar64.m_i = iVar30 + -1;
        RVar49.m_i = (int)(double)(~-(ulong)(2147483647.0 < auVar54._0_8_) & auVar66._0_8_ |
                                  -(ulong)(2147483647.0 < auVar54._0_8_) & 0x41dfffffffc00000) +
                     iVar16;
        RVar56.m_i = (int)(double)(~-(ulong)(2147483647.0 < auVar54._8_8_) & auVar66._8_8_ |
                                  -(ulong)(2147483647.0 < auVar54._8_8_) & 0x41dfffffffc00000) +
                     iVar30;
        local_1c8.y1.m_i = RVar64.m_i;
        local_1c8.x1.m_i = RVar62.m_i;
        local_1c8.y2.m_i = RVar56.m_i;
        local_1c8.x2.m_i = RVar49.m_i;
        QVar9.x2.m_i = RVar49.m_i;
        QVar9.y2.m_i = RVar56.m_i;
        QVar9.x1.m_i = RVar62.m_i;
        QVar9.y1.m_i = RVar64.m_i;
        auVar55._4_4_ = -(uint)(RVar49.m_i < RVar62.m_i);
        auVar55._0_4_ = -(uint)(RVar49.m_i < RVar62.m_i);
        auVar55._8_4_ = -(uint)(RVar56.m_i < RVar64.m_i);
        auVar55._12_4_ = -(uint)(RVar56.m_i < RVar64.m_i);
        iVar16 = movmskpd(0,auVar55);
        if (iVar16 == 0) {
          if (widget == (QWidget *)0x0) {
            local_1d8.x1.m_i = 0;
            local_1d8.y1.m_i = 0;
            local_1d8.x2.m_i = -1;
            local_1d8.y2.m_i = -1;
          }
          else {
            pQVar2 = widget->data;
            local_1d8.x2.m_i = (pQVar2->crect).x2.m_i - (pQVar2->crect).x1.m_i;
            local_1d8.y2.m_i = (pQVar2->crect).y2.m_i - (pQVar2->crect).y1.m_i;
            local_1d8.x1.m_i = 0;
            local_1d8.y1.m_i = 0;
            cVar14 = QRect::intersects(&local_1d8);
            QVar9.x2.m_i = local_1c8.x2.m_i;
            QVar9.y2.m_i = local_1c8.y2.m_i;
            QVar9.x1.m_i = local_1c8.x1.m_i;
            QVar9.y1.m_i = local_1c8.y1.m_i;
            if (cVar14 == '\0') goto LAB_0060b79f;
          }
          lVar31 = (this_00->extras).d.size;
          if (lVar31 != 0) {
            pQVar35 = &((this_00->extras).d.ptr)->value;
            do {
              if (*(int *)((long)(pQVar35 + -1) + 0x18) == 3) {
                ::QVariant::QVariant((QVariant *)local_98,pQVar35);
                goto LAB_0060aa0b;
              }
              pQVar35 = (QVariant *)((long)(pQVar35 + 1) + 8);
              lVar31 = lVar31 + -1;
            } while (lVar31 != 0);
          }
          local_98[0] = (code *)0x0;
          local_98[1] = (code *)0x0;
          local_98[2] = (code *)0x0;
          local_80 = 9.88131291682493e-324;
LAB_0060aa0b:
          uVar21 = ::QVariant::toSize();
          ::QVariant::~QVariant((QVariant *)local_98);
          iVar16 = (int)((ulong)uVar21 >> 0x20);
          if (iVar16 < 1 || (int)uVar21 < 1) {
LAB_0060aa40:
            local_98[0] = (code *)QVar25;
            pDVar22 = QHash<QPaintDevice_*,_QGraphicsItemCache::DeviceData>::operator[]
                                (&pQVar20->deviceData,(QPaintDevice **)local_98);
            local_1d9 = '\x01';
            puVar36 = &DAT_006f3c60;
            ppcVar38 = local_98;
            for (lVar31 = 10; lVar31 != 0; lVar31 = lVar31 + -1) {
              *ppcVar38 = (code *)*puVar36;
              puVar36 = puVar36 + (ulong)bVar47 * -2 + 1;
              ppcVar38 = ppcVar38 + (ulong)bVar47 * -2 + 1;
            }
            QTransform::inverted((bool *)local_98);
            if (local_1d9 == '\x01') {
              pQVar23 = (QTransform *)QPainter::worldTransform();
              QTransform::operator*=((QTransform *)local_98,pQVar23);
            }
            pqVar24 = (qreal *)QPainter::worldTransform();
            pqVar27 = pqVar24;
            pDVar39 = pDVar22;
            for (lVar31 = 9; lVar31 != 0; lVar31 = lVar31 + -1) {
              (pDVar39->lastTransform).m_matrix[0][0] = *pqVar27;
              pqVar27 = pqVar27 + (ulong)bVar47 * -2 + 1;
              pDVar39 = (DeviceData *)((long)pDVar39 + (ulong)bVar47 * -0x10 + 8);
            }
            *(undefined2 *)&(pDVar22->lastTransform).field_0x48 = *(undefined2 *)(pqVar24 + 9);
            if ((local_1d9 == '\x01') && (iVar16 = QTransform::type(), iVar16 < 2)) {
              pQVar23 = (QTransform *)QPainter::worldTransform();
              bVar12 = transformIsSimple(pQVar23);
              if (!bVar12) goto LAB_0060ab49;
              iVar30 = local_1d8.x1.m_i + -1;
              iVar16 = local_1d8.y1.m_i + -1;
              if (local_1d8.y2.m_i == iVar16 && local_1d8.x2.m_i == iVar30) {
                bVar12 = false;
                RVar49.m_i = iVar30;
                RVar56.m_i = iVar16;
                goto LAB_0060abaa;
              }
              if ((pDVar22->cacheIndent).yp.m_i == 0 && (pDVar22->cacheIndent).xp.m_i == 0) {
                bVar12 = false;
                RVar49.m_i = local_1d8.x2.m_i;
                RVar56.m_i = local_1d8.y2.m_i;
                goto LAB_0060abaa;
              }
              bVar12 = false;
LAB_0060ade4:
              local_1e8.d = (QRegionData *)&DAT_aaaaaaaaaaaaaaaa;
              QRegion::QRegion(&local_1e8);
LAB_0060adf4:
              QVar3 = (QPoint)(CONCAT44(local_1d8.y1.m_i - local_1c8.y1.m_i,
                                        local_1d8.x1.m_i - local_1c8.x1.m_i) &
                              CONCAT44(-(uint)(local_1c8.y1.m_i < local_1d8.y1.m_i),
                                       -(uint)(local_1c8.x1.m_i < local_1d8.x1.m_i)));
              local_1c8 = (QRect)QRect::operator&(&local_1c8,&local_1d8);
              uVar18 = QPixmap::isNull();
              if ((char)uVar18 != '\0') {
                (pDVar22->cacheIndent).xp = 0;
                (pDVar22->cacheIndent).yp = 0;
                pQVar20->allExposed = true;
                QList<QRectF>::clear(&pQVar20->exposed);
                bVar12 = true;
                uVar18 = extraout_EAX;
              }
              QVar1 = pDVar22->cacheIndent;
              local_298 = QVar3.xp.m_i;
              RStack_294 = QVar3.yp.m_i;
              auVar60._0_4_ = -(uint)(local_298.m_i == QVar1.xp.m_i.m_i);
              iVar16 = -(uint)(RStack_294.m_i == QVar1.yp.m_i.m_i);
              auVar60._4_4_ = auVar60._0_4_;
              auVar60._8_4_ = iVar16;
              auVar60._12_4_ = iVar16;
              iVar16 = movmskpd(uVar18,auVar60);
              if (iVar16 == 3) {
                iVar30 = local_1c8.x2.m_i - local_1c8.x1.m_i;
                iVar16 = local_1c8.y2.m_i - local_1c8.y1.m_i;
                local_e8.m_matrix[0][0] = (qreal)QPixmap::size();
                QVar25 = operator/((QSize *)&local_e8,c);
                if ((iVar30 + 1 != QVar25.wd.m_i.m_i) || (iVar16 + 1 != QVar25.ht.m_i.m_i)) {
                  QVar1 = pDVar22->cacheIndent;
                  goto LAB_0060aed6;
                }
              }
              else {
LAB_0060aed6:
                uVar45 = local_298.m_i - QVar1.xp.m_i;
                uVar61 = RStack_294.m_i - QVar1.yp.m_i;
                local_e8.m_matrix[0][2] = (qreal)&DAT_aaaaaaaaaaaaaaaa;
                local_e8.m_matrix[0][0] = (qreal)&DAT_aaaaaaaaaaaaaaaa;
                local_e8.m_matrix[0][1] = (qreal)&DAT_aaaaaaaaaaaaaaaa;
                local_158.xp = (qreal)CONCAT44((local_1c8.y2.m_i - local_1c8.y1.m_i) + 1,
                                               (local_1c8.x2.m_i - local_1c8.x1.m_i) + 1);
                local_138 = (undefined1  [8])operator*((QSize *)&local_158,c);
                QPixmap::QPixmap((QPixmap *)&local_e8,(QSize *)local_138);
                QColor::QColor((QColor *)local_138,transparent);
                QPixmap::fill((QColor *)&local_e8);
                cVar14 = QPixmap::isNull();
                if (cVar14 == '\0') {
                  QPixmap::setDevicePixelRatio(c);
                  local_158.xp = (qreal)&DAT_aaaaaaaaaaaaaaaa;
                  QPainter::QPainter((QPainter *)&local_158,(QPaintDevice *)&local_e8);
                  local_138 = (undefined1  [8])(double)(int)-uVar45;
                  uStack_130 = (undefined1 *)(double)(int)-uVar61;
                  QPainter::drawPixmap((QPointF *)&local_158,(QPixmap *)local_138);
                  QPainter::end();
                  QPainter::~QPainter((QPainter *)&local_158);
                }
                local_158.xp = (qreal)&DAT_aaaaaaaaaaaaaaaa;
                QRegion::QRegion((QRegion *)&local_158);
                local_218._0_8_ = QPixmap::size();
                QVar25 = operator/((QSize *)local_218,c);
                local_138._0_4_ = 0;
                local_138._4_4_ = 0;
                uStack_130 = (undefined1 *)CONCAT44(QVar25.ht.m_i.m_i + -1,QVar25.wd.m_i.m_i + -1);
                QRegion::operator+=((QRegion *)&local_158,(QRect *)local_138);
                cVar14 = QPixmap::isNull();
                if (cVar14 == '\0') {
                  local_238 = (QSize)QPixmap::size();
                  QVar25 = operator/(&local_238,c);
                  local_138._4_4_ = -uVar61;
                  local_138._0_4_ = -uVar45;
                  uStack_130 = (undefined1 *)
                               CONCAT44(~uVar61 + QVar25.ht.m_i.m_i,~uVar45 + QVar25.wd.m_i.m_i);
                  QRegion::QRegion((QRegion *)local_218,(QRect *)local_138,Rectangle);
                  QRegion::operator-=((QRegion *)&local_158,(QRegion *)local_218);
                  QRegion::~QRegion((QRegion *)local_218);
                }
                QRegion::operator=(&local_1e8,(QRegion *)&local_158);
                QPixmap::operator=((QPixmap *)&local_198,(QPixmap *)&local_e8);
                QRegion::~QRegion((QRegion *)&local_158);
                QPixmap::~QPixmap((QPixmap *)&local_e8);
                bVar12 = true;
              }
              pDVar22->cacheIndent = QVar3;
              QVar7 = local_1c8;
            }
            else {
LAB_0060ab49:
              pQVar20->allExposed = true;
              QList<QRectF>::clear(&pQVar20->exposed);
              (pDVar22->cacheIndent).xp = 0;
              (pDVar22->cacheIndent).yp = 0;
              QPixmap::QPixmap((QPixmap *)&local_e8);
              QPixmap::operator=((QPixmap *)&local_198,(QPixmap *)&local_e8);
              QPixmap::~QPixmap((QPixmap *)&local_e8);
              iVar30 = local_1d8.x1.m_i + -1;
              iVar16 = local_1d8.y1.m_i + -1;
              bVar12 = true;
              RVar49.m_i = local_1d8.x2.m_i;
              RVar56.m_i = local_1d8.y2.m_i;
LAB_0060abaa:
              if (((RVar49.m_i != iVar30) || (RVar56.m_i != iVar16)) &&
                 (cVar14 = QRect::contains(&local_1d8,SUB81(&local_1c8,0)), cVar14 == '\0')) {
                if ((double)((local_1d8.x2.m_i - local_1d8.x1.m_i) + 1) * 1.2 <
                    (double)((local_1c8.x2.m_i - local_1c8.x1.m_i) + 1)) goto LAB_0060ade4;
                iVar16 = local_1d8.y2.m_i - local_1d8.y1.m_i;
                iVar30 = local_1c8.y2.m_i - local_1c8.y1.m_i;
                local_1e8.d = (QRegionData *)&DAT_aaaaaaaaaaaaaaaa;
                QRegion::QRegion(&local_1e8);
                if ((double)(iVar30 + 1) <= (double)(iVar16 + 1) * 1.2) goto LAB_0060abe1;
                goto LAB_0060adf4;
              }
              local_1e8.d = (QRegionData *)&DAT_aaaaaaaaaaaaaaaa;
              QRegion::QRegion(&local_1e8);
LAB_0060abe1:
              (pDVar22->cacheIndent).xp = 0;
              (pDVar22->cacheIndent).yp = 0;
              iVar30 = local_1c8.x2.m_i - local_1c8.x1.m_i;
              iVar16 = local_1c8.y2.m_i - local_1c8.y1.m_i;
              local_e8.m_matrix[0][0] = (qreal)QPixmap::size();
              QVar25 = operator/((QSize *)&local_e8,c);
              QVar7.x2.m_i = local_1c8.x2.m_i;
              QVar7.y2.m_i = local_1c8.y2.m_i;
              QVar7.x1.m_i = local_1c8.x1.m_i;
              QVar7.y1.m_i = local_1c8.y1.m_i;
              if ((iVar30 + 1 != QVar25.wd.m_i.m_i) || (iVar16 + 1 != QVar25.ht.m_i.m_i)) {
                local_158.xp = (qreal)CONCAT44((local_1c8.y2.m_i - local_1c8.y1.m_i) + 1,
                                               (local_1c8.x2.m_i - local_1c8.x1.m_i) + 1);
                local_138 = (undefined1  [8])operator*((QSize *)&local_158,c);
                QPixmap::QPixmap((QPixmap *)&local_e8,(QSize *)local_138);
                QPixmap::operator=((QPixmap *)&local_198,(QPixmap *)&local_e8);
                QPixmap::~QPixmap((QPixmap *)&local_e8);
                pQVar20->allExposed = true;
                QList<QRectF>::clear(&pQVar20->exposed);
                QVar7.x2.m_i = local_1c8.x2.m_i;
                QVar7.y2.m_i = local_1c8.y2.m_i;
                QVar7.x1.m_i = local_1c8.x1.m_i;
                QVar7.y1.m_i = local_1c8.y1.m_i;
                bVar12 = true;
              }
            }
            local_1c8 = QVar7;
            if ((pQVar20->allExposed == false) && ((pQVar20->exposed).d.size == 0)) {
              cVar14 = QRegion::isEmpty();
              if (cVar14 == '\0') goto LAB_0060b178;
              if (bVar12) goto LAB_0060b665;
            }
            else {
LAB_0060b178:
              QVar8 = local_1c8;
              if (cVar13 != '\0') {
                QPixmapCache::remove(&local_180);
                QVar8 = local_1c8;
              }
              local_1c8._0_8_ = QVar8._0_8_;
              uVar21 = local_1c8._0_8_;
              local_1c8 = QVar8;
              pqVar27 = (qreal *)QPainter::worldTransform();
              pQVar23 = &local_e8;
              for (lVar31 = 10; lVar31 != 0; lVar31 = lVar31 + -1) {
                pQVar23->m_matrix[0][0] = *pqVar27;
                pqVar27 = pqVar27 + (ulong)bVar47 * -2 + 1;
                pQVar23 = (QTransform *)((long)pQVar23 + ((ulong)bVar47 * -2 + 1) * 8);
              }
              if ((ulong)uVar21 >> 0x20 != 0 || QVar8.x1.m_i.m_i != 0) {
                QTransform::fromTranslate(-(double)QVar8.x1.m_i.m_i,-(double)QVar8.y1.m_i.m_i);
                QTransform::operator*=(&local_e8,(QTransform *)local_138);
              }
              local_1f0.d = (QRegionData *)&DAT_aaaaaaaaaaaaaaaa;
              QRegion::QRegion(&local_1f0,&local_1e8);
              bVar15 = pQVar20->allExposed;
              if (((bool)bVar15 == false) && (lVar31 = (pQVar20->exposed).d.size, lVar31 != 0)) {
                lVar31 = lVar31 << 5;
                do {
                  QTransform::mapRect((QRectF *)local_138);
                  dVar63 = (double)((ulong)local_138 & 0x8000000000000000 | 0x3fe0000000000000) +
                           (double)local_138;
                  bVar12 = 2147483647.0 < dVar63;
                  if (dVar63 <= -2147483648.0) {
                    dVar63 = -2147483648.0;
                  }
                  dVar63 = (double)(-(ulong)bVar12 & 0x41dfffffffc00000 |
                                   ~-(ulong)bVar12 & (ulong)dVar63);
                  iVar16 = (int)dVar63;
                  dVar53 = (double)((ulong)uStack_130 & 0x8000000000000000 | 0x3fe0000000000000) +
                           (double)uStack_130;
                  bVar12 = 2147483647.0 < dVar53;
                  if (dVar53 <= -2147483648.0) {
                    dVar53 = -2147483648.0;
                  }
                  dVar53 = (double)(-(ulong)bVar12 & 0x41dfffffffc00000 |
                                   ~-(ulong)bVar12 & (ulong)dVar53);
                  iVar30 = (int)dVar53;
                  dVar63 = ((double)local_138 - (double)(int)dVar63) * 0.5 + (double)local_128;
                  dVar63 = (double)((ulong)dVar63 & 0x8000000000000000 | 0x3fe0000000000000) +
                           dVar63;
                  bVar12 = 2147483647.0 < dVar63;
                  if (dVar63 <= -2147483648.0) {
                    dVar63 = -2147483648.0;
                  }
                  dVar53 = ((double)uStack_130 - (double)(int)dVar53) * 0.5 + qStack_120;
                  dVar53 = (double)((ulong)dVar53 & 0x8000000000000000 | 0x3fe0000000000000) +
                           dVar53;
                  bVar46 = 2147483647.0 < dVar53;
                  if (dVar53 <= -2147483648.0) {
                    dVar53 = -2147483648.0;
                  }
                  local_158.xp = (qreal)CONCAT44(iVar30 + -1,iVar16 + -1);
                  local_158.yp = (qreal)CONCAT44((int)(double)(-(ulong)bVar46 & 0x41dfffffffc00000 |
                                                              ~-(ulong)bVar46 & (ulong)dVar53) +
                                                 iVar30,(int)(double)(-(ulong)bVar12 &
                                                                      0x41dfffffffc00000 |
                                                                     ~-(ulong)bVar12 & (ulong)dVar63
                                                                     ) + iVar16);
                  QRegion::operator+=(&local_1f0,(QRect *)&local_158);
                  lVar31 = lVar31 + -0x20;
                } while (lVar31 != 0);
                bVar15 = pQVar20->allExposed;
              }
              stack0xfffffffffffffdf8 = (undefined1  [16])0x0;
              local_218._0_16_ = (undefined1  [16])0x0;
              if ((bVar15 & 1) == 0) {
                lVar31 = (pQVar20->exposed).d.size;
                if (lVar31 != 0) {
                  lVar31 = lVar31 << 5;
                  do {
                    QRectF::operator|((QRectF *)local_138,(QRectF *)local_218);
                    qStack_200 = qStack_120;
                    local_218._16_8_ = local_128;
                    local_218._8_8_ = uStack_130;
                    local_218._0_8_ = local_138;
                    lVar31 = lVar31 + -0x20;
                  } while (lVar31 != 0);
                }
                puVar36 = &DAT_006f3c60;
                pbVar40 = (bool *)local_138;
                for (lVar31 = 10; lVar31 != 0; lVar31 = lVar31 + -1) {
                  *(undefined8 *)pbVar40 = *puVar36;
                  puVar36 = puVar36 + (ulong)bVar47 * -2 + 1;
                  pbVar40 = pbVar40 + (ulong)bVar47 * -0x10 + 8;
                }
                QTransform::inverted((bool *)local_138);
                lVar31 = QRegion::begin();
                lVar26 = QRegion::end();
                if (lVar31 != lVar26) {
                  do {
                    auVar66 = QTransform::mapRect((QRect *)local_138);
                    local_238 = (QSize)(double)auVar66._0_4_;
                    local_230 = (double)auVar66._4_4_;
                    local_228 = (double)(((long)auVar66._8_4_ - (long)auVar66._0_4_) + 1);
                    local_220 = (double)(((auVar66._8_8_ >> 0x20) - (auVar66._0_8_ >> 0x20)) + 1);
                    QRectF::operator|(&local_158,(QRectF *)local_218);
                    qStack_200 = local_158.h;
                    local_218._16_8_ = local_158.w;
                    local_218._8_8_ = local_158.yp;
                    local_218._0_8_ = local_158.xp;
                    lVar31 = lVar31 + 0x10;
                  } while (lVar31 != lVar26);
                }
              }
              else {
                (*item->_vptr_QGraphicsItem[3])(local_218,item);
              }
              QStyleOption::operator=
                        (&(this->styleOptionTmp).super_QStyleOption,&option->super_QStyleOption);
              (this->styleOptionTmp).exposedRect.xp = (double)local_218._0_8_ + -1.0;
              (this->styleOptionTmp).exposedRect.yp = (double)local_218._8_8_ + -1.0;
              (this->styleOptionTmp).exposedRect.w = (double)local_218._16_8_ + 1.0 + 1.0;
              (this->styleOptionTmp).exposedRect.h = qStack_200 + 1.0 + 1.0;
              QPixmap::setDevicePixelRatio(c);
              RVar17.super_QFlagsStorageHelper<QPainter::RenderHint,_4>.
              super_QFlagsStorage<QPainter::RenderHint>.i =
                   (QFlagsStorageHelper<QPainter::RenderHint,_4>)QPainter::renderHints();
              _q_paintIntoCache((QPixmap *)&local_198,item,&local_1f0,&local_e8,RVar17,
                                &this->styleOptionTmp,painterStateProtection);
              pQVar20->allExposed = false;
              QList<QRectF>::clear(&pQVar20->exposed);
              QRegion::~QRegion(&local_1f0);
LAB_0060b665:
              QPixmapCache::insert((QPixmap *)&local_e8);
              QVar25 = (QSize)(pDVar22->key).d;
              (pDVar22->key).d = (KeyData *)local_e8.m_matrix[0][0];
              local_e8.m_matrix[0][0] = (qreal)QVar25;
              QPixmapCache::Key::~Key((Key *)&local_e8);
            }
            pqVar27 = (qreal *)QPainter::worldTransform();
            pQVar23 = &local_e8;
            for (lVar31 = 10; lVar31 != 0; lVar31 = lVar31 + -1) {
              pQVar23->m_matrix[0][0] = *pqVar27;
              pqVar27 = pqVar27 + (ulong)bVar47 * -2 + 1;
              pQVar23 = (QTransform *)((long)pQVar23 + ((ulong)bVar47 * -2 + 1) * 8);
            }
            puVar36 = &DAT_006f3c18;
            puVar41 = (undefined8 *)local_138;
            for (lVar31 = 9; lVar31 != 0; lVar31 = lVar31 + -1) {
              *puVar41 = *puVar36;
              puVar36 = puVar36 + (ulong)bVar47 * -2 + 1;
              puVar41 = puVar41 + (ulong)bVar47 * -2 + 1;
            }
            local_f0 = 0;
            QPainter::setWorldTransform((QTransform *)painter,SUB81(local_138,0));
            if ((dVar52 != dVar50) || (NAN(dVar52) || NAN(dVar50))) {
              QPainter::setOpacity(dVar52);
              local_138 = (undefined1  [8])(double)local_1c8.x1.m_i.m_i;
              uStack_130 = (undefined1 *)(double)local_1c8.y1.m_i.m_i;
              QPainter::drawPixmap((QPointF *)painter,(QPixmap *)local_138);
              QPainter::setOpacity(dVar50);
            }
            else {
              local_138 = (undefined1  [8])(double)local_1c8.x1.m_i.m_i;
              uStack_130 = (undefined1 *)(double)local_1c8.y1.m_i.m_i;
              QPainter::drawPixmap((QPointF *)painter,(QPixmap *)local_138);
            }
            QPainter::setWorldTransform((QTransform *)painter,SUB81(&local_e8,0));
            QRegion::~QRegion(&local_1e8);
            QVar9 = local_1c8;
          }
          else {
            if ((local_1c8.x2.m_i - local_1c8.x1.m_i) + 1 <= (int)uVar21) {
              if ((local_1c8.y2.m_i - local_1c8.y1.m_i) + 1 <= iVar16) goto LAB_0060aa40;
            }
            _q_paintItem(item,painter,option,widget,(bool)(-(dVar50 != dVar52) & 1),
                         painterStateProtection);
            QVar9.x2.m_i = local_1c8.x2.m_i;
            QVar9.y2.m_i = local_1c8.y2.m_i;
            QVar9.x1.m_i = local_1c8.x1.m_i;
            QVar9.y1.m_i = local_1c8.y1.m_i;
          }
        }
      }
    }
LAB_0060b79f:
    local_1c8 = QVar9;
    QPixmap::~QPixmap((QPixmap *)&local_198);
    QPixmapCache::Key::~Key(&local_180);
    QVar8 = local_1c8;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
LAB_0060b7e5:
  local_1c8 = QVar8;
  __stack_chk_fail();
}

Assistant:

void QGraphicsScenePrivate::drawItemHelper(QGraphicsItem *item, QPainter *painter,
                                           const QStyleOptionGraphicsItem *option, QWidget *widget,
                                           bool painterStateProtection)
{
    QGraphicsItemPrivate *itemd = item->d_ptr.data();
    QGraphicsItem::CacheMode cacheMode = QGraphicsItem::CacheMode(itemd->cacheMode);

    // Render directly, using no cache.
    if (cacheMode == QGraphicsItem::NoCache) {
        _q_paintItem(static_cast<QGraphicsWidget *>(item), painter, option, widget, true, painterStateProtection);
        return;
    }

    const qreal devicePixelRatio = painter->device()->devicePixelRatio();
    const qreal oldPainterOpacity = painter->opacity();
    qreal newPainterOpacity = oldPainterOpacity;
    QGraphicsProxyWidget *proxy = item->isWidget() ? qobject_cast<QGraphicsProxyWidget *>(static_cast<QGraphicsWidget *>(item)) : 0;
    if (proxy && proxy->widget()) {
        const qreal windowOpacity = proxy->widget()->windowOpacity();
        if (windowOpacity < 1.0)
            newPainterOpacity *= windowOpacity;
    }

    // Item's (local) bounding rect
    QRectF brect = item->boundingRect();
    QRectF adjustedBrect(brect);
    _q_adjustRect(&adjustedBrect);
    if (adjustedBrect.isEmpty())
        return;

    // Fetch the off-screen transparent buffer and exposed area info.
    QPixmapCache::Key pixmapKey;
    QPixmap pix;

    bool pixmapFound;
    QGraphicsItemCache *itemCache = itemd->extraItemCache();
    if (cacheMode == QGraphicsItem::ItemCoordinateCache) {
        pixmapKey = itemCache->key;
    } else {
        pixmapKey = itemCache->deviceData.value(widget).key;
    }

    // Find pixmap in cache.
    pixmapFound = QPixmapCache::find(pixmapKey, &pix);

    // Render using item coordinate cache mode.
    if (cacheMode == QGraphicsItem::ItemCoordinateCache) {
        QSize pixmapSize;
        bool fixedCacheSize = itemCache->fixedSize.isValid();
        QRect br = brect.toAlignedRect();
        if (fixedCacheSize) {
            pixmapSize = itemCache->fixedSize;
        } else {
            pixmapSize = br.size();
        }

        pixmapSize *= devicePixelRatio;

        // Create or recreate the pixmap.
        int adjust = itemCache->fixedSize.isValid() ? 0 : 2;
        QSize adjustSize(adjust*2, adjust*2);
        br.adjust(-adjust / devicePixelRatio, -adjust / devicePixelRatio, adjust / devicePixelRatio, adjust / devicePixelRatio);
        if (pix.isNull() || (!fixedCacheSize && (pixmapSize + adjustSize) != pix.size())) {
            pix = QPixmap(pixmapSize + adjustSize);
            itemCache->boundingRect = br;
            itemCache->exposed.clear();
            itemCache->allExposed = true;
        } else if (itemCache->boundingRect != br) {
            itemCache->boundingRect = br;
            itemCache->exposed.clear();
            itemCache->allExposed = true;
        }

        // Redraw any newly exposed areas.
        if (itemCache->allExposed || !itemCache->exposed.isEmpty()) {

            //We know that we will modify the pixmap, removing it from the cache
            //will detach the one we have and avoid a deep copy
            if (pixmapFound)
                QPixmapCache::remove(pixmapKey);

            // Fit the item's bounding rect into the pixmap's coordinates.
            QTransform itemToPixmap;
            if (fixedCacheSize) {
                const QPointF scale((pixmapSize.width() / devicePixelRatio) / brect.width(),
                                    (pixmapSize.height() / devicePixelRatio) / brect.height());
                itemToPixmap.scale(scale.x(), scale.y());
            }
            itemToPixmap.translate(-br.x(), -br.y());

            // Generate the item's exposedRect and map its list of expose
            // rects to device coordinates.
            styleOptionTmp = *option;
            QRegion pixmapExposed;
            QRectF exposedRect;
            if (!itemCache->allExposed) {
                for (const auto &rect : std::as_const(itemCache->exposed)) {
                    exposedRect |= rect;
                    pixmapExposed += itemToPixmap.mapRect(rect).toAlignedRect();
                }
            } else {
                exposedRect = brect;
            }
            styleOptionTmp.exposedRect = exposedRect;

            // Render.
            pix.setDevicePixelRatio(devicePixelRatio);
            _q_paintIntoCache(&pix, item, pixmapExposed, itemToPixmap, painter->renderHints(),
                              &styleOptionTmp, painterStateProtection);

            // insert this pixmap into the cache.
            itemCache->key = QPixmapCache::insert(pix);

            // Reset expose data.
            itemCache->allExposed = false;
            itemCache->exposed.clear();
        }

        // Redraw the exposed area using the transformed painter. Depending on
        // the hardware, this may be a server-side operation, or an expensive
        // qpixmap-image-transform-pixmap roundtrip.
        if (newPainterOpacity != oldPainterOpacity) {
            painter->setOpacity(newPainterOpacity);
            painter->drawPixmap(br.topLeft(), pix);
            painter->setOpacity(oldPainterOpacity);
        } else {
            painter->drawPixmap(br.topLeft(), pix);
        }
        return;
    }

    // Render using device coordinate cache mode.
    if (cacheMode == QGraphicsItem::DeviceCoordinateCache) {
        // Find the item's bounds in device coordinates.
        QRectF deviceBounds = painter->worldTransform().mapRect(brect);
        QRect deviceRect = deviceBounds.toRect().adjusted(-1, -1, 1, 1);
        if (deviceRect.isEmpty())
            return;
        QRect viewRect = widget ? widget->rect() : QRect();
        if (widget && !viewRect.intersects(deviceRect))
            return;

        // Resort to direct rendering if the device rect exceeds the
        // (optional) maximum bounds. (QGraphicsSvgItem uses this).
        QSize maximumCacheSize =
            itemd->extra(QGraphicsItemPrivate::ExtraMaxDeviceCoordCacheSize).toSize();
        if (!maximumCacheSize.isEmpty()
            && (deviceRect.width() > maximumCacheSize.width()
                || deviceRect.height() > maximumCacheSize.height())) {
            _q_paintItem(static_cast<QGraphicsWidget *>(item), painter, option, widget,
                         oldPainterOpacity != newPainterOpacity, painterStateProtection);
            return;
        }

        // Create or reuse offscreen pixmap, possibly scroll/blit from the old one.
        // If the world transform is rotated we always recreate the cache to avoid
        // wrong blending.
        bool pixModified = false;
        QGraphicsItemCache::DeviceData *deviceData = &itemCache->deviceData[widget];
        bool invertable = true;
        QTransform diff = deviceData->lastTransform.inverted(&invertable);
        if (invertable)
            diff *= painter->worldTransform();
        deviceData->lastTransform = painter->worldTransform();
        bool allowPartialCacheExposure = false;
        bool simpleTransform = invertable && diff.type() <= QTransform::TxTranslate
                               && transformIsSimple(painter->worldTransform());
        if (!simpleTransform) {
            pixModified = true;
            itemCache->allExposed = true;
            itemCache->exposed.clear();
            deviceData->cacheIndent = QPoint();
            pix = QPixmap();
        } else if (!viewRect.isNull()) {
            allowPartialCacheExposure = deviceData->cacheIndent != QPoint();
        }

        // Allow partial cache exposure if the device rect isn't fully contained and
        // deviceRect is 20% taller or wider than the viewRect.
        if (!allowPartialCacheExposure && !viewRect.isNull() && !viewRect.contains(deviceRect)) {
            allowPartialCacheExposure = (viewRect.width() * 1.2 < deviceRect.width())
                                         || (viewRect.height() * 1.2 < deviceRect.height());
        }

        QRegion scrollExposure;
        if (allowPartialCacheExposure) {
            // Part of pixmap is drawn. Either device contains viewrect (big
            // item covers whole screen) or parts of device are outside the
            // viewport. In either case the device rect must be the intersect
            // between the two.
            int dx = deviceRect.left() < viewRect.left() ? viewRect.left() - deviceRect.left() : 0;
            int dy = deviceRect.top() < viewRect.top() ? viewRect.top() - deviceRect.top() : 0;
            QPoint newCacheIndent(dx, dy);
            deviceRect &= viewRect;

            if (pix.isNull()) {
                deviceData->cacheIndent = QPoint();
                itemCache->allExposed = true;
                itemCache->exposed.clear();
                pixModified = true;
            }

            // Copy / "scroll" the old pixmap onto the new ole and calculate
            // scrolled exposure.
            if (newCacheIndent != deviceData->cacheIndent || deviceRect.size() != pix.size() / devicePixelRatio) {
                QPoint diff = newCacheIndent - deviceData->cacheIndent;
                QPixmap newPix(deviceRect.size() * devicePixelRatio);
                // ### Investigate removing this fill (test with Plasma and
                // graphicssystem raster).
                newPix.fill(Qt::transparent);
                if (!pix.isNull()) {
                    newPix.setDevicePixelRatio(devicePixelRatio);
                    QPainter newPixPainter(&newPix);
                    newPixPainter.drawPixmap(-diff, pix);
                    newPixPainter.end();
                }
                QRegion exposed;
                exposed += QRect(QPoint(0,0), newPix.size() / devicePixelRatio);
                if (!pix.isNull())
                    exposed -= QRect(-diff, pix.size() / devicePixelRatio);
                scrollExposure = exposed;

                pix = newPix;
                pixModified = true;
            }
            deviceData->cacheIndent = newCacheIndent;
        } else {
            // Full pixmap is drawn.
            deviceData->cacheIndent = QPoint();

            // Auto-adjust the pixmap size.
            if (deviceRect.size() != pix.size() / devicePixelRatio) {
                // exposed needs to cover the whole pixmap
                pix = QPixmap(deviceRect.size() * devicePixelRatio);
                pixModified = true;
                itemCache->allExposed = true;
                itemCache->exposed.clear();
            }
        }

        // Check for newly invalidated areas.
        if (itemCache->allExposed || !itemCache->exposed.isEmpty() || !scrollExposure.isEmpty()) {
            //We know that we will modify the pixmap, removing it from the cache
            //will detach the one we have and avoid a deep copy
            if (pixmapFound)
                QPixmapCache::remove(pixmapKey);

            // Construct an item-to-pixmap transform.
            QPointF p = deviceRect.topLeft();
            QTransform itemToPixmap = painter->worldTransform();
            if (!p.isNull())
                itemToPixmap *= QTransform::fromTranslate(-p.x(), -p.y());

            // Map the item's logical expose to pixmap coordinates.
            QRegion pixmapExposed = scrollExposure;
            if (!itemCache->allExposed) {
                for (const auto &rect : std::as_const(itemCache->exposed))
                    pixmapExposed += itemToPixmap.mapRect(rect).toRect().adjusted(-1, -1, 1, 1);
            }

            // Calculate the style option's exposedRect.
            QRectF br;
            if (itemCache->allExposed) {
                br = item->boundingRect();
            } else {
                for (const auto &rect : std::as_const(itemCache->exposed))
                    br |= rect;
                QTransform pixmapToItem = itemToPixmap.inverted();
                for (const QRect &r : std::as_const(scrollExposure))
                    br |= pixmapToItem.mapRect(r);
            }
            styleOptionTmp = *option;
            styleOptionTmp.exposedRect = br.adjusted(-1, -1, 1, 1);

            // Render the exposed areas.
            pix.setDevicePixelRatio(devicePixelRatio);
            _q_paintIntoCache(&pix, item, pixmapExposed, itemToPixmap, painter->renderHints(),
                              &styleOptionTmp, painterStateProtection);

            // Reset expose data.
            pixModified = true;
            itemCache->allExposed = false;
            itemCache->exposed.clear();
        }

        if (pixModified) {
            // Insert this pixmap into the cache.
            deviceData->key = QPixmapCache::insert(pix);
        }

        // Redraw the exposed area using an untransformed painter. This
        // effectively becomes a bitblit that does not transform the cache.
        QTransform restoreTransform = painter->worldTransform();
        painter->setWorldTransform(QTransform());
        if (newPainterOpacity != oldPainterOpacity) {
            painter->setOpacity(newPainterOpacity);
            painter->drawPixmap(deviceRect.topLeft(), pix);
            painter->setOpacity(oldPainterOpacity);
        } else {
            painter->drawPixmap(deviceRect.topLeft(), pix);
        }
        painter->setWorldTransform(restoreTransform);
        return;
    }
}